

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map2json.c
# Opt level: O0

void map2json_destroy(map2json_t *obj)

{
  void *in_RDI;
  
  map2json_freePairsMemory((map2json_keyvalue_t *)0x103501);
  map2json_freeTreeMemory((map2json_tree_t *)0x10350e);
  safe_destroy((csafestring_t *)0x10351b);
  free(in_RDI);
  return;
}

Assistant:

void map2json_destroy(map2json_t *obj) {
	DEBUG_PUT("map2json_destroy([map2json_t *])... ");
	map2json_freePairsMemory(obj->pairs);
	map2json_freeTreeMemory(obj->tree);
	safe_destroy(obj->buffer);
	free(obj);
	DEBUG_PUT("map2json_destroy([map2json_t *])... DONE");
}